

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

void translateImmediate(MCInst *mcInst,uint64_t immediate,OperandSpecifier *operand,
                       InternalInstruction *insn)

{
  char cVar1;
  uint uVar2;
  long in_RCX;
  undefined1 *in_RDX;
  ulong in_RSI;
  MCInst *in_RDI;
  uint NewOpc_2;
  uint NewOpc_1;
  uint NewOpc;
  OperandType type;
  uint local_30;
  uint local_2c;
  uint local_28;
  ulong local_10;
  
  cVar1 = in_RDX[1];
  local_10 = in_RSI;
  if (cVar1 == 'I') {
    switch(*(undefined1 *)(in_RCX + 0xf2)) {
    case 1:
      if ((in_RSI & 0x80) != 0) {
        local_10 = in_RSI | 0xffffffffffffff00;
      }
      break;
    case 2:
      if ((in_RSI & 0x8000) != 0) {
        local_10 = in_RSI | 0xffffffffffff0000;
      }
      break;
    default:
      break;
    case 4:
      if ((in_RSI & 0x80000000) != 0) {
        local_10 = in_RSI | 0xffffffff00000000;
      }
      break;
    case 8:
    }
  }
  else if ((((cVar1 == '\f') || (cVar1 == '\r')) || (cVar1 == '\x0e')) ||
          ((cVar1 == '\x0f' || (cVar1 == 'H')))) {
    switch(*in_RDX) {
    case 0x11:
      if ((in_RSI & 0x80) != 0) {
        local_10 = in_RSI | 0xffffffffffffff00;
      }
      break;
    case 0x12:
      if ((in_RSI & 0x8000) != 0) {
        local_10 = in_RSI | 0xffffffffffff0000;
      }
      break;
    case 0x13:
      if ((in_RSI & 0x80000000) != 0) {
        local_10 = in_RSI | 0xffffffff00000000;
      }
      break;
    case 0x14:
    }
  }
  else if (cVar1 == '\x10') {
    if (7 < in_RSI) {
      local_28 = 0;
      uVar2 = MCInst_getOpcode(in_RDI);
      if (uVar2 == 0x230) {
        local_28 = 0x231;
      }
      else if (uVar2 == 0x232) {
        local_28 = 0x233;
      }
      else if (uVar2 == 0x234) {
        local_28 = 0x235;
      }
      else if (uVar2 == 0x236) {
        local_28 = 0x237;
      }
      else if (uVar2 == 0x239) {
        local_28 = 0x23a;
      }
      else if (uVar2 == 0x23b) {
        local_28 = 0x23c;
      }
      else if (uVar2 == 0x23f) {
        local_28 = 0x240;
      }
      else if (uVar2 == 0x241) {
        local_28 = 0x242;
      }
      else if (uVar2 == 0x19db) {
        local_28 = 0x19dc;
      }
      else if (uVar2 == 0x19dd) {
        local_28 = 0x19de;
      }
      else if (uVar2 == 0x19df) {
        local_28 = 0x19e0;
      }
      else if (uVar2 == 0x19e1) {
        local_28 = 0x19e2;
      }
      else if (uVar2 == 0x19f5) {
        local_28 = 0x19f6;
      }
      else if (uVar2 == 0x19f7) {
        local_28 = 0x19f8;
      }
      else if (uVar2 == 0x19f9) {
        local_28 = 0x19fa;
      }
      else if (uVar2 == 0x19fb) {
        local_28 = 0x19fc;
      }
      else if (uVar2 == 0x19fd) {
        local_28 = 0x19fe;
      }
      else if (uVar2 == 0x19ff) {
        local_28 = 0x1a00;
      }
      else if (uVar2 == 0x1a01) {
        local_28 = 0x1a02;
      }
      else if (uVar2 == 0x1a03) {
        local_28 = 0x1a04;
      }
      else if (uVar2 == 0x1a05) {
        local_28 = 0x1a06;
      }
      else if (uVar2 == 0x1a07) {
        local_28 = 0x1a08;
      }
      else if (uVar2 == 0x1a09) {
        local_28 = 0x1a0a;
      }
      else if (uVar2 == 0x1a0b) {
        local_28 = 0x1a0c;
      }
      if (local_28 != 0) {
        MCInst_setOpcode(in_RDI,local_28);
      }
    }
  }
  else if (cVar1 == '\x11') {
    if (0x1f < in_RSI) {
      local_2c = 0;
      uVar2 = MCInst_getOpcode(in_RDI);
      switch(uVar2) {
      case 0xcc5:
        local_2c = 0xcc6;
        break;
      default:
        break;
      case 0xcc7:
        local_2c = 0xcc8;
        break;
      case 0xcc9:
        local_2c = 0xcca;
        break;
      case 0xccb:
        local_2c = 0xccc;
        break;
      case 0xccd:
        local_2c = 0xcce;
        break;
      case 0xccf:
        local_2c = 0xcd0;
        break;
      case 0xcd1:
        local_2c = 0xcd2;
        break;
      case 0xcd3:
        local_2c = 0xcd4;
        break;
      case 0xcd5:
        local_2c = 0xcd6;
        break;
      case 0xcd7:
        local_2c = 0xcd8;
        break;
      case 0xcd9:
        local_2c = 0xcda;
        break;
      case 0xcdb:
        local_2c = 0xcdc;
        break;
      case 0xcdd:
        local_2c = 0xcde;
        break;
      case 0xcdf:
        local_2c = 0xce0;
        break;
      case 0xce1:
        local_2c = 0xce2;
        break;
      case 0xce3:
        local_2c = 0xce4;
        break;
      case 0xce5:
        local_2c = 0xce6;
        break;
      case 0xce7:
        local_2c = 0xce8;
        break;
      case 0xce9:
        local_2c = 0xcea;
        break;
      case 0xceb:
        local_2c = 0xcec;
        break;
      case 0xced:
        local_2c = 0xcee;
        break;
      case 0xcef:
        local_2c = 0xcf0;
      }
      if (local_2c != 0) {
        MCInst_setOpcode(in_RDI,local_2c);
      }
    }
  }
  else if ((cVar1 == '\x12') && ((7 < in_RSI || ((in_RSI & 3) == 3)))) {
    uVar2 = MCInst_getOpcode(in_RDI);
    switch(uVar2) {
    default:
    case 0x1843:
      local_30 = 0x1844;
      break;
    case 0x1845:
      local_30 = 0x1846;
      break;
    case 0x1847:
      local_30 = 0x1848;
      break;
    case 0x1849:
      local_30 = 0x184a;
      break;
    case 0x184b:
      local_30 = 0x184c;
      break;
    case 0x184d:
      local_30 = 0x184e;
      break;
    case 0x184f:
      local_30 = 0x1850;
      break;
    case 0x1851:
      local_30 = 0x1852;
      break;
    case 0x1853:
      local_30 = 0x1854;
      break;
    case 0x1855:
      local_30 = 0x1856;
      break;
    case 0x1857:
      local_30 = 0x1858;
      break;
    case 0x1859:
      local_30 = 0x185a;
      break;
    case 0x185b:
      local_30 = 0x185c;
      break;
    case 0x185d:
      local_30 = 0x185e;
      break;
    case 0x185f:
      local_30 = 0x1860;
      break;
    case 0x1861:
      local_30 = 0x1862;
      break;
    case 0x1863:
      local_30 = 0x1864;
      break;
    case 0x1865:
      local_30 = 0x1866;
      break;
    case 0x1867:
      local_30 = 0x1868;
      break;
    case 0x1869:
      local_30 = 0x186a;
      break;
    case 0x186b:
      local_30 = 0x186c;
      break;
    case 0x186d:
      local_30 = 0x186e;
      break;
    case 0x186f:
      local_30 = 0x1870;
      break;
    case 0x1871:
      local_30 = 0x1872;
      break;
    case 0x1873:
      local_30 = 0x1874;
      break;
    case 0x1875:
      local_30 = 0x1876;
      break;
    case 0x1877:
      local_30 = 0x1878;
      break;
    case 0x1879:
      local_30 = 0x187a;
      break;
    case 0x187b:
      local_30 = 0x187c;
      break;
    case 0x187d:
      local_30 = 0x187e;
      break;
    case 0x1927:
      local_30 = 0x1928;
      break;
    case 0x1929:
      local_30 = 0x192a;
      break;
    case 0x192b:
      local_30 = 0x192c;
      break;
    case 0x192d:
      local_30 = 0x192e;
      break;
    case 0x192f:
      local_30 = 0x1930;
      break;
    case 0x1931:
      local_30 = 0x1932;
      break;
    case 0x1933:
      local_30 = 0x1934;
      break;
    case 0x1935:
      local_30 = 0x1936;
      break;
    case 0x1937:
      local_30 = 0x1938;
      break;
    case 0x1939:
      local_30 = 0x193a;
      break;
    case 0x193b:
      local_30 = 0x193c;
      break;
    case 0x193d:
      local_30 = 0x193e;
      break;
    case 0x193f:
      local_30 = 0x1940;
      break;
    case 0x1941:
      local_30 = 0x1942;
      break;
    case 0x1943:
      local_30 = 0x1944;
      break;
    case 0x1945:
      local_30 = 0x1946;
      break;
    case 0x1947:
      local_30 = 0x1948;
      break;
    case 0x1949:
      local_30 = 0x194a;
      break;
    case 0x194b:
      local_30 = 0x194c;
      break;
    case 0x194d:
      local_30 = 0x194e;
      break;
    case 0x194f:
      local_30 = 0x1950;
      break;
    case 0x1951:
      local_30 = 0x1952;
      break;
    case 0x1953:
      local_30 = 0x1954;
      break;
    case 0x1955:
      local_30 = 0x1956;
      break;
    case 0x1957:
      local_30 = 0x1958;
      break;
    case 0x1959:
      local_30 = 0x195a;
      break;
    case 0x195b:
      local_30 = 0x195c;
      break;
    case 0x195d:
      local_30 = 0x195e;
      break;
    case 0x195f:
      local_30 = 0x1960;
      break;
    case 0x1961:
      local_30 = 0x1962;
      break;
    case 0x1963:
      local_30 = 0x1964;
      break;
    case 0x1965:
      local_30 = 0x1966;
      break;
    case 0x1967:
      local_30 = 0x1968;
      break;
    case 0x1969:
      local_30 = 0x196a;
      break;
    case 0x196b:
      local_30 = 0x196c;
      break;
    case 0x196d:
      local_30 = 0x196e;
      break;
    case 0x196f:
      local_30 = 0x1970;
      break;
    case 0x1971:
      local_30 = 0x1972;
      break;
    case 0x1973:
      local_30 = 0x1974;
      break;
    case 0x1975:
      local_30 = 0x1976;
      break;
    case 0x1977:
      local_30 = 0x1978;
      break;
    case 0x1979:
      local_30 = 0x197a;
      break;
    case 0x197b:
      local_30 = 0x197c;
      break;
    case 0x197d:
      local_30 = 0x197e;
      break;
    case 0x197f:
      local_30 = 0x1980;
      break;
    case 0x1981:
      local_30 = 0x1982;
      break;
    case 0x1983:
      local_30 = 0x1984;
      break;
    case 0x1985:
      local_30 = 0x1986;
      break;
    case 0x1987:
      local_30 = 0x1988;
      break;
    case 0x1989:
      local_30 = 0x198a;
      break;
    case 0x198b:
      local_30 = 0x198c;
      break;
    case 0x198d:
      local_30 = 0x198e;
      break;
    case 0x198f:
      local_30 = 0x1990;
      break;
    case 0x1991:
      local_30 = 0x1992;
      break;
    case 0x1993:
      local_30 = 0x1994;
      break;
    case 0x1995:
      local_30 = 0x1996;
      break;
    case 0x1997:
      local_30 = 0x1998;
      break;
    case 0x1999:
      local_30 = 0x199a;
      break;
    case 0x199b:
      local_30 = 0x199c;
      break;
    case 0x199d:
      local_30 = 0x199e;
      break;
    case 0x199f:
      local_30 = 0x19a0;
      break;
    case 0x19a1:
      local_30 = 0x19a2;
      break;
    case 0x19a3:
      local_30 = 0x19a4;
      break;
    case 0x19a5:
      local_30 = 0x19a6;
      break;
    case 0x19a7:
      local_30 = 0x19a8;
      break;
    case 0x19a9:
      local_30 = 0x19aa;
      break;
    case 0x19ab:
      local_30 = 0x19ac;
      break;
    case 0x19ad:
      local_30 = 0x19ae;
      break;
    case 0x19af:
      local_30 = 0x19b0;
      break;
    case 0x19b1:
      local_30 = 0x19b2;
      break;
    case 0x19b3:
      local_30 = 0x19b4;
      break;
    case 0x19b5:
      local_30 = 0x19b6;
      break;
    case 0x19b7:
      local_30 = 0x19b8;
      break;
    case 0x19b9:
      local_30 = 0x19ba;
      break;
    case 0x19bb:
      local_30 = 0x19bc;
      break;
    case 0x19bd:
      local_30 = 0x19be;
      break;
    case 0x19bf:
      local_30 = 0x19c0;
      break;
    case 0x19c1:
      local_30 = 0x19c2;
      break;
    case 0x19c3:
      local_30 = 0x19c4;
      break;
    case 0x19c5:
      local_30 = 0x19c6;
      break;
    case 0x19c7:
      local_30 = 0x19c8;
      break;
    case 0x19c9:
      local_30 = 0x19ca;
      break;
    case 0x19cb:
      local_30 = 0x19cc;
      break;
    case 0x19cd:
      local_30 = 0x19ce;
      break;
    case 0x19cf:
      local_30 = 0x19d0;
      break;
    case 0x19d1:
      local_30 = 0x19d2;
      break;
    case 0x19d3:
      local_30 = 0x19d4;
      break;
    case 0x19d5:
      local_30 = 0x19d6;
      break;
    case 0x19d7:
      local_30 = 0x19d8;
      break;
    case 0x19d9:
      local_30 = 0x19da;
    }
    if (local_30 != 0) {
      MCInst_setOpcode(in_RDI,local_30);
    }
  }
  switch(cVar1) {
  case '\x01':
    if ((local_10 & 0x80) != 0) {
      local_10 = local_10 | 0xffffffffffffff00;
    }
    break;
  default:
    break;
  case '\x03':
  case '\x04':
    if ((local_10 & 0x80000000) != 0) {
      local_10 = local_10 | 0xffffffff00000000;
    }
    break;
  case '6':
  case '7':
  case '8':
    MCOperand_CreateReg0(in_RDI,((uint)(local_10 >> 4) & 0xfffffff) + 0x7a);
    return;
  case '9':
    MCOperand_CreateReg0(in_RDI,((uint)(local_10 >> 4) & 0xfffffff) + 0x9a);
    return;
  case ':':
    MCOperand_CreateReg0(in_RDI,((uint)(local_10 >> 4) & 0xfffffff) + 0xba);
    return;
  }
  MCOperand_CreateImm0(in_RDI,local_10);
  if ((((cVar1 == '+') || (cVar1 == ',')) || (cVar1 == '-')) || (cVar1 == '.')) {
    MCOperand_CreateReg0(in_RDI,(uint)""[*(uint *)(in_RCX + 0x6c)]);
  }
  return;
}

Assistant:

static void translateImmediate(MCInst *mcInst, uint64_t immediate,
		const OperandSpecifier *operand, InternalInstruction *insn)
{
	OperandType type;

	type = (OperandType)operand->type;
	if (type == TYPE_RELv) {
		//isBranch = true;
		//pcrel = insn->startLocation + insn->immediateOffset + insn->immediateSize;
		switch (insn->displacementSize) {
			case 1:
				if (immediate & 0x80)
					immediate |= ~(0xffull);
				break;
			case 2:
				if (immediate & 0x8000)
					immediate |= ~(0xffffull);
				break;
			case 4:
				if (immediate & 0x80000000)
					immediate |= ~(0xffffffffull);
				break;
			case 8:
				break;
			default:
				break;
		}
	} // By default sign-extend all X86 immediates based on their encoding.
	else if (type == TYPE_IMM8 || type == TYPE_IMM16 || type == TYPE_IMM32 ||
			type == TYPE_IMM64 || type == TYPE_IMMv) {

		switch (operand->encoding) {
			default:
				break;
			case ENCODING_IB:
				if(immediate & 0x80)
					immediate |= ~(0xffull);
				break;
			case ENCODING_IW:
				if(immediate & 0x8000)
					immediate |= ~(0xffffull);
				break;
			case ENCODING_ID:
				if(immediate & 0x80000000)
					immediate |= ~(0xffffffffull);
				break;
			case ENCODING_IO:
				break;
		}
	} else if (type == TYPE_IMM3) {
#ifndef CAPSTONE_X86_REDUCE
		// Check for immediates that printSSECC can't handle.
		if (immediate >= 8) {
			unsigned NewOpc = 0;

			switch (MCInst_getOpcode(mcInst)) {
				default: break;	// never reach
				case X86_CMPPDrmi:  NewOpc = X86_CMPPDrmi_alt;  break;
				case X86_CMPPDrri:  NewOpc = X86_CMPPDrri_alt;  break;
				case X86_CMPPSrmi:  NewOpc = X86_CMPPSrmi_alt;  break;
				case X86_CMPPSrri:  NewOpc = X86_CMPPSrri_alt;  break;
				case X86_CMPSDrm:   NewOpc = X86_CMPSDrm_alt;   break;
				case X86_CMPSDrr:   NewOpc = X86_CMPSDrr_alt;   break;
				case X86_CMPSSrm:   NewOpc = X86_CMPSSrm_alt;   break;
				case X86_CMPSSrr:   NewOpc = X86_CMPSSrr_alt;   break;
				case X86_VPCOMBri:  NewOpc = X86_VPCOMBri_alt;  break;
				case X86_VPCOMBmi:  NewOpc = X86_VPCOMBmi_alt;  break;
				case X86_VPCOMWri:  NewOpc = X86_VPCOMWri_alt;  break;
				case X86_VPCOMWmi:  NewOpc = X86_VPCOMWmi_alt;  break;
				case X86_VPCOMDri:  NewOpc = X86_VPCOMDri_alt;  break;
				case X86_VPCOMDmi:  NewOpc = X86_VPCOMDmi_alt;  break;
				case X86_VPCOMQri:  NewOpc = X86_VPCOMQri_alt;  break;
				case X86_VPCOMQmi:  NewOpc = X86_VPCOMQmi_alt;  break;
				case X86_VPCOMUBri: NewOpc = X86_VPCOMUBri_alt; break;
				case X86_VPCOMUBmi: NewOpc = X86_VPCOMUBmi_alt; break;
				case X86_VPCOMUWri: NewOpc = X86_VPCOMUWri_alt; break;
				case X86_VPCOMUWmi: NewOpc = X86_VPCOMUWmi_alt; break;
				case X86_VPCOMUDri: NewOpc = X86_VPCOMUDri_alt; break;
				case X86_VPCOMUDmi: NewOpc = X86_VPCOMUDmi_alt; break;
				case X86_VPCOMUQri: NewOpc = X86_VPCOMUQri_alt; break;
				case X86_VPCOMUQmi: NewOpc = X86_VPCOMUQmi_alt; break;
			}
			// Switch opcode to the one that doesn't get special printing.
			if (NewOpc != 0) {
				MCInst_setOpcode(mcInst, NewOpc);
			}
		}
#endif
	} else if (type == TYPE_IMM5) {
#ifndef CAPSTONE_X86_REDUCE
		// Check for immediates that printAVXCC can't handle.
		if (immediate >= 32) {
			unsigned NewOpc = 0;

			switch (MCInst_getOpcode(mcInst)) {
				default: break; // unexpected opcode
				case X86_VCMPPDrmi:   NewOpc = X86_VCMPPDrmi_alt;   break;
				case X86_VCMPPDrri:   NewOpc = X86_VCMPPDrri_alt;   break;
				case X86_VCMPPSrmi:   NewOpc = X86_VCMPPSrmi_alt;   break;
				case X86_VCMPPSrri:   NewOpc = X86_VCMPPSrri_alt;   break;
				case X86_VCMPSDrm:    NewOpc = X86_VCMPSDrm_alt;    break;
				case X86_VCMPSDrr:    NewOpc = X86_VCMPSDrr_alt;    break;
				case X86_VCMPSSrm:    NewOpc = X86_VCMPSSrm_alt;    break;
				case X86_VCMPSSrr:    NewOpc = X86_VCMPSSrr_alt;    break;
				case X86_VCMPPDYrmi:  NewOpc = X86_VCMPPDYrmi_alt;  break;
				case X86_VCMPPDYrri:  NewOpc = X86_VCMPPDYrri_alt;  break;
				case X86_VCMPPSYrmi:  NewOpc = X86_VCMPPSYrmi_alt;  break;
				case X86_VCMPPSYrri:  NewOpc = X86_VCMPPSYrri_alt;  break;
				case X86_VCMPPDZrmi:  NewOpc = X86_VCMPPDZrmi_alt;  break;
				case X86_VCMPPDZrri:  NewOpc = X86_VCMPPDZrri_alt;  break;
				case X86_VCMPPDZrrib: NewOpc = X86_VCMPPDZrrib_alt; break;
				case X86_VCMPPSZrmi:  NewOpc = X86_VCMPPSZrmi_alt;  break;
				case X86_VCMPPSZrri:  NewOpc = X86_VCMPPSZrri_alt;  break;
				case X86_VCMPPSZrrib: NewOpc = X86_VCMPPSZrrib_alt; break;
				case X86_VCMPSDZrm:   NewOpc = X86_VCMPSDZrmi_alt;  break;
				case X86_VCMPSDZrr:   NewOpc = X86_VCMPSDZrri_alt;  break;
				case X86_VCMPSSZrm:   NewOpc = X86_VCMPSSZrmi_alt;  break;
				case X86_VCMPSSZrr:   NewOpc = X86_VCMPSSZrri_alt;  break;
			}
			// Switch opcode to the one that doesn't get special printing.
			if (NewOpc != 0) {
				MCInst_setOpcode(mcInst, NewOpc);
			}
		}
#endif
	} else if (type == TYPE_AVX512ICC) {
#ifndef CAPSTONE_X86_REDUCE
		if (immediate >= 8 || ((immediate & 0x3) == 3)) {
			unsigned NewOpc = 0;
			switch (MCInst_getOpcode(mcInst)) {
				default: // llvm_unreachable("unexpected opcode");
				case X86_VPCMPBZ128rmi:    NewOpc = X86_VPCMPBZ128rmi_alt;    break;
				case X86_VPCMPBZ128rmik:   NewOpc = X86_VPCMPBZ128rmik_alt;   break;
				case X86_VPCMPBZ128rri:    NewOpc = X86_VPCMPBZ128rri_alt;    break;
				case X86_VPCMPBZ128rrik:   NewOpc = X86_VPCMPBZ128rrik_alt;   break;
				case X86_VPCMPBZ256rmi:    NewOpc = X86_VPCMPBZ256rmi_alt;    break;
				case X86_VPCMPBZ256rmik:   NewOpc = X86_VPCMPBZ256rmik_alt;   break;
				case X86_VPCMPBZ256rri:    NewOpc = X86_VPCMPBZ256rri_alt;    break;
				case X86_VPCMPBZ256rrik:   NewOpc = X86_VPCMPBZ256rrik_alt;   break;
				case X86_VPCMPBZrmi:       NewOpc = X86_VPCMPBZrmi_alt;       break;
				case X86_VPCMPBZrmik:      NewOpc = X86_VPCMPBZrmik_alt;      break;
				case X86_VPCMPBZrri:       NewOpc = X86_VPCMPBZrri_alt;       break;
				case X86_VPCMPBZrrik:      NewOpc = X86_VPCMPBZrrik_alt;      break;
				case X86_VPCMPDZ128rmi:    NewOpc = X86_VPCMPDZ128rmi_alt;    break;
				case X86_VPCMPDZ128rmib:   NewOpc = X86_VPCMPDZ128rmib_alt;   break;
				case X86_VPCMPDZ128rmibk:  NewOpc = X86_VPCMPDZ128rmibk_alt;  break;
				case X86_VPCMPDZ128rmik:   NewOpc = X86_VPCMPDZ128rmik_alt;   break;
				case X86_VPCMPDZ128rri:    NewOpc = X86_VPCMPDZ128rri_alt;    break;
				case X86_VPCMPDZ128rrik:   NewOpc = X86_VPCMPDZ128rrik_alt;   break;
				case X86_VPCMPDZ256rmi:    NewOpc = X86_VPCMPDZ256rmi_alt;    break;
				case X86_VPCMPDZ256rmib:   NewOpc = X86_VPCMPDZ256rmib_alt;   break;
				case X86_VPCMPDZ256rmibk:  NewOpc = X86_VPCMPDZ256rmibk_alt;  break;
				case X86_VPCMPDZ256rmik:   NewOpc = X86_VPCMPDZ256rmik_alt;   break;
				case X86_VPCMPDZ256rri:    NewOpc = X86_VPCMPDZ256rri_alt;    break;
				case X86_VPCMPDZ256rrik:   NewOpc = X86_VPCMPDZ256rrik_alt;   break;
				case X86_VPCMPDZrmi:       NewOpc = X86_VPCMPDZrmi_alt;       break;
				case X86_VPCMPDZrmib:      NewOpc = X86_VPCMPDZrmib_alt;      break;
				case X86_VPCMPDZrmibk:     NewOpc = X86_VPCMPDZrmibk_alt;     break;
				case X86_VPCMPDZrmik:      NewOpc = X86_VPCMPDZrmik_alt;      break;
				case X86_VPCMPDZrri:       NewOpc = X86_VPCMPDZrri_alt;       break;
				case X86_VPCMPDZrrik:      NewOpc = X86_VPCMPDZrrik_alt;      break;
				case X86_VPCMPQZ128rmi:    NewOpc = X86_VPCMPQZ128rmi_alt;    break;
				case X86_VPCMPQZ128rmib:   NewOpc = X86_VPCMPQZ128rmib_alt;   break;
				case X86_VPCMPQZ128rmibk:  NewOpc = X86_VPCMPQZ128rmibk_alt;  break;
				case X86_VPCMPQZ128rmik:   NewOpc = X86_VPCMPQZ128rmik_alt;   break;
				case X86_VPCMPQZ128rri:    NewOpc = X86_VPCMPQZ128rri_alt;    break;
				case X86_VPCMPQZ128rrik:   NewOpc = X86_VPCMPQZ128rrik_alt;   break;
				case X86_VPCMPQZ256rmi:    NewOpc = X86_VPCMPQZ256rmi_alt;    break;
				case X86_VPCMPQZ256rmib:   NewOpc = X86_VPCMPQZ256rmib_alt;   break;
				case X86_VPCMPQZ256rmibk:  NewOpc = X86_VPCMPQZ256rmibk_alt;  break;
				case X86_VPCMPQZ256rmik:   NewOpc = X86_VPCMPQZ256rmik_alt;   break;
				case X86_VPCMPQZ256rri:    NewOpc = X86_VPCMPQZ256rri_alt;    break;
				case X86_VPCMPQZ256rrik:   NewOpc = X86_VPCMPQZ256rrik_alt;   break;
				case X86_VPCMPQZrmi:       NewOpc = X86_VPCMPQZrmi_alt;       break;
				case X86_VPCMPQZrmib:      NewOpc = X86_VPCMPQZrmib_alt;      break;
				case X86_VPCMPQZrmibk:     NewOpc = X86_VPCMPQZrmibk_alt;     break;
				case X86_VPCMPQZrmik:      NewOpc = X86_VPCMPQZrmik_alt;      break;
				case X86_VPCMPQZrri:       NewOpc = X86_VPCMPQZrri_alt;       break;
				case X86_VPCMPQZrrik:      NewOpc = X86_VPCMPQZrrik_alt;      break;
				case X86_VPCMPUBZ128rmi:   NewOpc = X86_VPCMPUBZ128rmi_alt;   break;
				case X86_VPCMPUBZ128rmik:  NewOpc = X86_VPCMPUBZ128rmik_alt;  break;
				case X86_VPCMPUBZ128rri:   NewOpc = X86_VPCMPUBZ128rri_alt;   break;
				case X86_VPCMPUBZ128rrik:  NewOpc = X86_VPCMPUBZ128rrik_alt;  break;
				case X86_VPCMPUBZ256rmi:   NewOpc = X86_VPCMPUBZ256rmi_alt;   break;
				case X86_VPCMPUBZ256rmik:  NewOpc = X86_VPCMPUBZ256rmik_alt;  break;
				case X86_VPCMPUBZ256rri:   NewOpc = X86_VPCMPUBZ256rri_alt;   break;
				case X86_VPCMPUBZ256rrik:  NewOpc = X86_VPCMPUBZ256rrik_alt;  break;
				case X86_VPCMPUBZrmi:      NewOpc = X86_VPCMPUBZrmi_alt;      break;
				case X86_VPCMPUBZrmik:     NewOpc = X86_VPCMPUBZrmik_alt;     break;
				case X86_VPCMPUBZrri:      NewOpc = X86_VPCMPUBZrri_alt;      break;
				case X86_VPCMPUBZrrik:     NewOpc = X86_VPCMPUBZrrik_alt;     break;
				case X86_VPCMPUDZ128rmi:   NewOpc = X86_VPCMPUDZ128rmi_alt;   break;
				case X86_VPCMPUDZ128rmib:  NewOpc = X86_VPCMPUDZ128rmib_alt;  break;
				case X86_VPCMPUDZ128rmibk: NewOpc = X86_VPCMPUDZ128rmibk_alt; break;
				case X86_VPCMPUDZ128rmik:  NewOpc = X86_VPCMPUDZ128rmik_alt;  break;
				case X86_VPCMPUDZ128rri:   NewOpc = X86_VPCMPUDZ128rri_alt;   break;
				case X86_VPCMPUDZ128rrik:  NewOpc = X86_VPCMPUDZ128rrik_alt;  break;
				case X86_VPCMPUDZ256rmi:   NewOpc = X86_VPCMPUDZ256rmi_alt;   break;
				case X86_VPCMPUDZ256rmib:  NewOpc = X86_VPCMPUDZ256rmib_alt;  break;
				case X86_VPCMPUDZ256rmibk: NewOpc = X86_VPCMPUDZ256rmibk_alt; break;
				case X86_VPCMPUDZ256rmik:  NewOpc = X86_VPCMPUDZ256rmik_alt;  break;
				case X86_VPCMPUDZ256rri:   NewOpc = X86_VPCMPUDZ256rri_alt;   break;
				case X86_VPCMPUDZ256rrik:  NewOpc = X86_VPCMPUDZ256rrik_alt;  break;
				case X86_VPCMPUDZrmi:      NewOpc = X86_VPCMPUDZrmi_alt;      break;
				case X86_VPCMPUDZrmib:     NewOpc = X86_VPCMPUDZrmib_alt;     break;
				case X86_VPCMPUDZrmibk:    NewOpc = X86_VPCMPUDZrmibk_alt;    break;
				case X86_VPCMPUDZrmik:     NewOpc = X86_VPCMPUDZrmik_alt;     break;
				case X86_VPCMPUDZrri:      NewOpc = X86_VPCMPUDZrri_alt;      break;
				case X86_VPCMPUDZrrik:     NewOpc = X86_VPCMPUDZrrik_alt;     break;
				case X86_VPCMPUQZ128rmi:   NewOpc = X86_VPCMPUQZ128rmi_alt;   break;
				case X86_VPCMPUQZ128rmib:  NewOpc = X86_VPCMPUQZ128rmib_alt;  break;
				case X86_VPCMPUQZ128rmibk: NewOpc = X86_VPCMPUQZ128rmibk_alt; break;
				case X86_VPCMPUQZ128rmik:  NewOpc = X86_VPCMPUQZ128rmik_alt;  break;
				case X86_VPCMPUQZ128rri:   NewOpc = X86_VPCMPUQZ128rri_alt;   break;
				case X86_VPCMPUQZ128rrik:  NewOpc = X86_VPCMPUQZ128rrik_alt;  break;
				case X86_VPCMPUQZ256rmi:   NewOpc = X86_VPCMPUQZ256rmi_alt;   break;
				case X86_VPCMPUQZ256rmib:  NewOpc = X86_VPCMPUQZ256rmib_alt;  break;
				case X86_VPCMPUQZ256rmibk: NewOpc = X86_VPCMPUQZ256rmibk_alt; break;
				case X86_VPCMPUQZ256rmik:  NewOpc = X86_VPCMPUQZ256rmik_alt;  break;
				case X86_VPCMPUQZ256rri:   NewOpc = X86_VPCMPUQZ256rri_alt;   break;
				case X86_VPCMPUQZ256rrik:  NewOpc = X86_VPCMPUQZ256rrik_alt;  break;
				case X86_VPCMPUQZrmi:      NewOpc = X86_VPCMPUQZrmi_alt;      break;
				case X86_VPCMPUQZrmib:     NewOpc = X86_VPCMPUQZrmib_alt;     break;
				case X86_VPCMPUQZrmibk:    NewOpc = X86_VPCMPUQZrmibk_alt;    break;
				case X86_VPCMPUQZrmik:     NewOpc = X86_VPCMPUQZrmik_alt;     break;
				case X86_VPCMPUQZrri:      NewOpc = X86_VPCMPUQZrri_alt;      break;
				case X86_VPCMPUQZrrik:     NewOpc = X86_VPCMPUQZrrik_alt;     break;
				case X86_VPCMPUWZ128rmi:   NewOpc = X86_VPCMPUWZ128rmi_alt;   break;
				case X86_VPCMPUWZ128rmik:  NewOpc = X86_VPCMPUWZ128rmik_alt;  break;
				case X86_VPCMPUWZ128rri:   NewOpc = X86_VPCMPUWZ128rri_alt;   break;
				case X86_VPCMPUWZ128rrik:  NewOpc = X86_VPCMPUWZ128rrik_alt;  break;
				case X86_VPCMPUWZ256rmi:   NewOpc = X86_VPCMPUWZ256rmi_alt;   break;
				case X86_VPCMPUWZ256rmik:  NewOpc = X86_VPCMPUWZ256rmik_alt;  break;
				case X86_VPCMPUWZ256rri:   NewOpc = X86_VPCMPUWZ256rri_alt;   break;
				case X86_VPCMPUWZ256rrik:  NewOpc = X86_VPCMPUWZ256rrik_alt;  break;
				case X86_VPCMPUWZrmi:      NewOpc = X86_VPCMPUWZrmi_alt;      break;
				case X86_VPCMPUWZrmik:     NewOpc = X86_VPCMPUWZrmik_alt;     break;
				case X86_VPCMPUWZrri:      NewOpc = X86_VPCMPUWZrri_alt;      break;
				case X86_VPCMPUWZrrik:     NewOpc = X86_VPCMPUWZrrik_alt;     break;
				case X86_VPCMPWZ128rmi:    NewOpc = X86_VPCMPWZ128rmi_alt;    break;
				case X86_VPCMPWZ128rmik:   NewOpc = X86_VPCMPWZ128rmik_alt;   break;
				case X86_VPCMPWZ128rri:    NewOpc = X86_VPCMPWZ128rri_alt;    break;
				case X86_VPCMPWZ128rrik:   NewOpc = X86_VPCMPWZ128rrik_alt;   break;
				case X86_VPCMPWZ256rmi:    NewOpc = X86_VPCMPWZ256rmi_alt;    break;
				case X86_VPCMPWZ256rmik:   NewOpc = X86_VPCMPWZ256rmik_alt;   break;
				case X86_VPCMPWZ256rri:    NewOpc = X86_VPCMPWZ256rri_alt;    break;
				case X86_VPCMPWZ256rrik:   NewOpc = X86_VPCMPWZ256rrik_alt;   break;
				case X86_VPCMPWZrmi:       NewOpc = X86_VPCMPWZrmi_alt;       break;
				case X86_VPCMPWZrmik:      NewOpc = X86_VPCMPWZrmik_alt;      break;
				case X86_VPCMPWZrri:       NewOpc = X86_VPCMPWZrri_alt;       break;
				case X86_VPCMPWZrrik:      NewOpc = X86_VPCMPWZrrik_alt;      break;
			}
			// Switch opcode to the one that doesn't get special printing.
			if (NewOpc != 0) {
				MCInst_setOpcode(mcInst, NewOpc);
			}
		}
#endif
	}

	switch (type) {
		case TYPE_XMM32:
		case TYPE_XMM64:
		case TYPE_XMM128:
			MCOperand_CreateReg0(mcInst, X86_XMM0 + ((uint32_t)immediate >> 4));
			return;
		case TYPE_XMM256:
			MCOperand_CreateReg0(mcInst, X86_YMM0 + ((uint32_t)immediate >> 4));
			return;
		case TYPE_XMM512:
			MCOperand_CreateReg0(mcInst, X86_ZMM0 + ((uint32_t)immediate >> 4));
			return;
		case TYPE_REL8:
			if(immediate & 0x80)
				immediate |= ~(0xffull);
			break;
		case TYPE_REL32:
		case TYPE_REL64:
			if(immediate & 0x80000000)
				immediate |= ~(0xffffffffull);
			break;
		default:
			// operand is 64 bits wide.  Do nothing.
			break;
	}

	MCOperand_CreateImm0(mcInst, immediate);

	if (type == TYPE_MOFFS8 || type == TYPE_MOFFS16 ||
			type == TYPE_MOFFS32 || type == TYPE_MOFFS64) {
		MCOperand_CreateReg0(mcInst, segmentRegnums[insn->segmentOverride]);
	}
}